

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O3

void VP8SetIntra16Mode(VP8EncIterator *it,int mode)

{
  int *piVar1;
  int iVar2;
  
  piVar1 = (int *)it->preds_;
  iVar2 = 4;
  do {
    *piVar1 = (mode & 0xffU) * 0x1010101;
    piVar1 = (int *)((long)piVar1 + (long)it->enc_->preds_w_);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  *(byte *)it->mb_ = (*(byte *)it->mb_ & 0xfc) + 1;
  return;
}

Assistant:

void VP8SetIntra16Mode(const VP8EncIterator* const it, int mode) {
  uint8_t* preds = it->preds_;
  int y;
  for (y = 0; y < 4; ++y) {
    memset(preds, mode, 4);
    preds += it->enc_->preds_w_;
  }
  it->mb_->type_ = 1;
}